

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

Vec_Int_t * updateAnteConseVectors(antecedentConsequentVectorsStruct *anteConse)

{
  int iVar1;
  int iVar2;
  int local_28;
  int i;
  int iElem;
  Vec_Int_t *vCandMonotone;
  antecedentConsequentVectorsStruct *anteConse_local;
  
  if ((anteConse->attrAntecedents == (Vec_Int_t *)0x0) ||
     (iVar1 = Vec_IntSize(anteConse->attrAntecedents), iVar1 < 1)) {
    anteConse_local = (antecedentConsequentVectorsStruct *)anteConse->attrConsequentCandidates;
  }
  else {
    anteConse_local = (antecedentConsequentVectorsStruct *)Vec_IntAlloc(0);
    for (local_28 = 0; iVar1 = Vec_IntSize(anteConse->attrConsequentCandidates), local_28 < iVar1;
        local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(anteConse->attrConsequentCandidates,local_28);
      iVar2 = Vec_IntFind(anteConse->attrAntecedents,iVar1);
      if (iVar2 == -1) {
        Vec_IntPush((Vec_Int_t *)anteConse_local,iVar1);
      }
    }
  }
  return (Vec_Int_t *)anteConse_local;
}

Assistant:

Vec_Int_t *updateAnteConseVectors(struct antecedentConsequentVectorsStruct *anteConse )
{
    Vec_Int_t *vCandMonotone;
    int iElem, i;

    //if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
    //    return vHintMonotone;
    if( anteConse->attrAntecedents == NULL  || Vec_IntSize(anteConse->attrAntecedents) <= 0 )
        return anteConse->attrConsequentCandidates;
    vCandMonotone = Vec_IntAlloc(0);
    Vec_IntForEachEntry( anteConse->attrConsequentCandidates, iElem, i )
    {
        if( Vec_IntFind( anteConse->attrAntecedents, iElem ) == -1 )
            Vec_IntPush( vCandMonotone, iElem );
    }
    
    return vCandMonotone;
}